

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline_pass.cpp
# Opt level: O3

uint32_t __thiscall
spvtools::opt::InlinePass::CreateReturnVar
          (InlinePass *this,Function *calleeFn,
          vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
          *new_vars)

{
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> _Var1;
  IRContext *pIVar2;
  TypeManager *this_00;
  DecorationManager *this_01;
  long *plVar3;
  Instruction *pIVar4;
  Function *pFVar5;
  uint32_t uVar6;
  int iVar7;
  uint32_t ty_id;
  uint32_t from;
  Type *pTVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar9;
  string message;
  size_type __dnew;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> local_c8;
  Instruction *local_c0;
  IRContext *local_b8;
  Function *local_b0;
  char *local_a8;
  undefined1 local_a0 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_80;
  undefined1 local_78 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  _Var1._M_head_impl =
       (calleeFn->def_inst_)._M_t.
       super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
       ._M_t.
       super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
       .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  uVar6 = 0;
  if ((_Var1._M_head_impl)->has_type_id_ == true) {
    uVar6 = Instruction::GetSingleWordOperand(_Var1._M_head_impl,0);
  }
  pIVar2 = (this->super_Pass).context_;
  if ((pIVar2->valid_analyses_ & kAnalysisTypes) == kAnalysisNone) {
    IRContext::BuildTypeManager(pIVar2);
  }
  this_00 = (pIVar2->type_mgr_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
            .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>._M_head_impl;
  pTVar8 = analysis::TypeManager::GetType(this_00,uVar6);
  iVar7 = (*pTVar8->_vptr_Type[5])(pTVar8);
  if (CONCAT44(extraout_var,iVar7) != 0) {
    __assert_fail("type_mgr->GetType(calleeTypeId)->AsVoid() == nullptr && \"Cannot create a return variable of type void.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/inline_pass.cpp"
                  ,0xbf,
                  "uint32_t spvtools::opt::InlinePass::CreateReturnVar(Function *, std::vector<std::unique_ptr<Instruction>> *)"
                 );
  }
  ty_id = analysis::TypeManager::FindPointerToType(this_00,uVar6,Function);
  if ((ty_id != 0) || (ty_id = AddPointerToType(this,uVar6,Function), ty_id != 0)) {
    pIVar2 = (this->super_Pass).context_;
    uVar6 = Module::TakeNextIdBound
                      ((pIVar2->module_)._M_t.
                       super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                       .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl);
    if ((uVar6 == 0) && ((pIVar2->consumer_).super__Function_base._M_manager != (_Manager_type)0x0))
    {
      local_78._0_8_ = (_func_int **)0x25;
      local_a8 = local_a0 + 8;
      local_a8 = (char *)std::__cxx11::string::_M_create((ulong *)&local_a8,(ulong)local_78);
      local_a0._8_8_ = local_78._0_8_;
      builtin_strncpy(local_a8,"ID overflow. Try running compact-ids.",0x25);
      local_a0._0_8_ = local_78._0_8_;
      local_a8[local_78._0_8_] = '\0';
      local_78._0_8_ = (_func_int **)0x0;
      local_78._8_8_ = 0;
      local_78._16_4_ = (array<signed_char,_4UL>)0x0;
      local_78._20_4_ = (array<signed_char,_4UL>)0x0;
      std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>
      ::operator()(&pIVar2->consumer_,SPV_MSG_ERROR,"",(spv_position_t *)local_78,local_a8);
      if (local_a8 == local_a0 + 8) {
        return 0;
      }
      operator_delete(local_a8,local_a0._8_8_ + 1);
      return 0;
    }
    if (uVar6 != 0) {
      local_b0 = calleeFn;
      local_c0 = (Instruction *)operator_new(0x70);
      local_b8 = (this->super_Pass).context_;
      local_78._24_8_ = local_78 + 0x10;
      local_78._0_8_ = &PTR__SmallVector_003d7c78;
      local_58._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
      local_78._16_4_ = (array<signed_char,_4UL>)0x7;
      local_78._8_8_ = 1;
      local_a8 = (char *)CONCAT44(local_a8._4_4_,0x11);
      local_a0._0_8_ = &PTR__SmallVector_003d7c78;
      local_a0._8_8_ = 0;
      local_a0._24_8_ = local_a0 + 0x10;
      local_80._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
      utils::SmallVector<unsigned_int,_2UL>::operator=
                ((SmallVector<unsigned_int,_2UL> *)local_a0,
                 (SmallVector<unsigned_int,_2UL> *)local_78);
      local_48 = 0;
      uStack_40 = 0;
      local_38 = 0;
      std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
      _M_range_initialize<spvtools::opt::Operand_const*>
                ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)&local_48,
                 &local_a8,local_78);
      pIVar4 = local_c0;
      Instruction::Instruction(local_c0,local_b8,OpVariable,ty_id,uVar6,(OperandList *)&local_48);
      local_c8._M_head_impl = pIVar4;
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                 &local_48);
      local_a0._0_8_ = &PTR__SmallVector_003d7c78;
      if (local_80._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                   &local_80,local_80._M_head_impl);
      }
      pFVar5 = local_b0;
      local_80._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
      local_78._0_8_ = &PTR__SmallVector_003d7c78;
      if (local_58._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                   &local_58,local_58._M_head_impl);
      }
      std::
      vector<std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>,std::allocator<std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>>>
      ::
      emplace_back<std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>>
                ((vector<std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>,std::allocator<std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>>>
                  *)new_vars,
                 (unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                  *)&local_c8);
      pIVar2 = (this->super_Pass).context_;
      if ((pIVar2->valid_analyses_ & kAnalysisDecorations) == kAnalysisNone) {
        IRContext::BuildDecorationManager(pIVar2);
      }
      this_01 = (pIVar2->decoration_mgr_)._M_t.
                super___uniq_ptr_impl<spvtools::opt::analysis::DecorationManager,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::analysis::DecorationManager_*,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
                .super__Head_base<0UL,_spvtools::opt::analysis::DecorationManager_*,_false>.
                _M_head_impl;
      _Var1._M_head_impl =
           (pFVar5->def_inst_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
           .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
      from = 0;
      if ((_Var1._M_head_impl)->has_result_id_ == true) {
        from = Instruction::GetSingleWordOperand
                         (_Var1._M_head_impl,(uint)(_Var1._M_head_impl)->has_type_id_);
      }
      analysis::DecorationManager::CloneDecorations(this_01,from,uVar6);
      pTVar8 = analysis::TypeManager::GetType(this_00,ty_id);
      iVar7 = (*pTVar8->_vptr_Type[0x1f])(pTVar8);
      plVar3 = *(long **)(CONCAT44(extraout_var_00,iVar7) + 0x28);
      lVar9 = (**(code **)(*plVar3 + 0x100))(plVar3);
      if ((lVar9 != 0) &&
         (lVar9 = (**(code **)(*plVar3 + 0x100))(plVar3), *(int *)(lVar9 + 0x30) == 0x14e5)) {
        pIVar2 = (this->super_Pass).context_;
        if ((pIVar2->valid_analyses_ & kAnalysisDecorations) == kAnalysisNone) {
          IRContext::BuildDecorationManager(pIVar2);
        }
        analysis::DecorationManager::AddDecoration
                  ((pIVar2->decoration_mgr_)._M_t.
                   super___uniq_ptr_impl<spvtools::opt::analysis::DecorationManager,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_spvtools::opt::analysis::DecorationManager_*,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
                   .super__Head_base<0UL,_spvtools::opt::analysis::DecorationManager_*,_false>.
                   _M_head_impl,uVar6,0x14ec);
      }
      if (local_c8._M_head_impl == (Instruction *)0x0) {
        return uVar6;
      }
      (*((local_c8._M_head_impl)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
        _vptr_IntrusiveNodeBase[1])();
      return uVar6;
    }
  }
  return 0;
}

Assistant:

uint32_t InlinePass::CreateReturnVar(
    Function* calleeFn, std::vector<std::unique_ptr<Instruction>>* new_vars) {
  uint32_t returnVarId = 0;
  const uint32_t calleeTypeId = calleeFn->type_id();
  analysis::TypeManager* type_mgr = context()->get_type_mgr();
  assert(type_mgr->GetType(calleeTypeId)->AsVoid() == nullptr &&
         "Cannot create a return variable of type void.");
  // Find or create ptr to callee return type.
  uint32_t returnVarTypeId =
      type_mgr->FindPointerToType(calleeTypeId, spv::StorageClass::Function);

  if (returnVarTypeId == 0) {
    returnVarTypeId =
        AddPointerToType(calleeTypeId, spv::StorageClass::Function);
    if (returnVarTypeId == 0) {
      return 0;
    }
  }

  // Add return var to new function scope variables.
  returnVarId = context()->TakeNextId();
  if (returnVarId == 0) {
    return 0;
  }

  std::unique_ptr<Instruction> var_inst(new Instruction(
      context(), spv::Op::OpVariable, returnVarTypeId, returnVarId,
      {{spv_operand_type_t::SPV_OPERAND_TYPE_STORAGE_CLASS,
        {(uint32_t)spv::StorageClass::Function}}}));
  new_vars->push_back(std::move(var_inst));
  get_decoration_mgr()->CloneDecorations(calleeFn->result_id(), returnVarId);

  // Decorate the return var with AliasedPointer if the storage class of the
  // pointee type is PhysicalStorageBuffer.
  auto const pointee_type =
      type_mgr->GetType(returnVarTypeId)->AsPointer()->pointee_type();
  if (pointee_type->AsPointer() != nullptr) {
    if (pointee_type->AsPointer()->storage_class() ==
        spv::StorageClass::PhysicalStorageBuffer) {
      get_decoration_mgr()->AddDecoration(
          returnVarId, uint32_t(spv::Decoration::AliasedPointer));
    }
  }

  return returnVarId;
}